

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O1

int * __thiscall
cornerstone::async_result<int,_std::shared_ptr<std::exception>_>::get
          (async_result<int,_std::shared_ptr<std::exception>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->lock_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (this->has_result_ != true) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  if ((this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    return &this->result_;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  puVar2[1] = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  __cxa_throw(puVar2,&std::shared_ptr<std::exception>::typeinfo,
              std::__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr);
}

Assistant:

T& get()
    {
        std::unique_lock<std::mutex> lock(lock_);
        if (has_result_)
        {
            if (err_ == nullptr)
            {
                return result_;
            }

            throw err_;
        }

        cv_.wait(lock);
        if (err_ == nullptr)
        {
            return result_;
        }

        throw err_;
    }